

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

FILE_conflict * open_config_file(fnchar *filename)

{
  FILE *__s;
  int *piVar1;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    piVar1 = __errno_location();
    if ((*piVar1 == 0x14) || (*piVar1 == 2)) {
      __s = fopen(filename,"w");
    }
    else {
      __s = (FILE *)0x0;
    }
  }
  if (__s == (FILE *)0x0) {
    open_config_file_cold_1();
    __s = (FILE *)0x0;
  }
  else {
    chmod(filename,0x1a4);
    fwrite("# note: this file is rewritten whenever options are changed ingame\n",0x43,1,__s);
  }
  return (FILE_conflict *)__s;
}

Assistant:

static FILE *open_config_file(fnchar *filename)
{
    FILE *fp;

    fp = fopen(filename, "w");
    if (!fp && (errno == ENOTDIR || errno == ENOENT)) {
	fp = fopen(filename, "w");
    }

    if (!fp) {
	fprintf(stderr, "could not open " FN_FMT ": %s", filename, strerror(errno));
	return NULL;
    }

#ifdef UNIX
    chmod(filename, 0644);
#endif

    fprintf(fp, "# note: this file is rewritten whenever options are changed ingame\n");

    return fp;
}